

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_example.cpp
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main() {
  ATTR_MAYBE_UNUSED int a = foo4();  // No warning: unused variable 'a'.

  switch (a) {
    case 1:
      ATTR_FALLTHROUGH
    default:
      break;
  }

  return 0;
}